

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-core.c
# Opt level: O0

int uv__platform_loop_init(uv_loop_t *loop)

{
  int *piVar1;
  int local_1c;
  int fd;
  uv_loop_t *loop_local;
  
  local_1c = uv__epoll_create1(0x80000);
  if ((local_1c == -1) &&
     (((piVar1 = __errno_location(), *piVar1 == 0x26 ||
       (piVar1 = __errno_location(), *piVar1 == 0x16)) &&
      (local_1c = uv__epoll_create(0x100), local_1c != -1)))) {
    uv__cloexec_ioctl(local_1c,1);
  }
  loop->backend_fd = local_1c;
  loop->inotify_fd = -1;
  loop->inotify_watchers = (void *)0x0;
  if (local_1c == -1) {
    piVar1 = __errno_location();
    loop_local._4_4_ = -*piVar1;
  }
  else {
    loop_local._4_4_ = 0;
  }
  return loop_local._4_4_;
}

Assistant:

int uv__platform_loop_init(uv_loop_t* loop) {
  int fd;

  fd = uv__epoll_create1(UV__EPOLL_CLOEXEC);

  /* epoll_create1() can fail either because it's not implemented (old kernel)
   * or because it doesn't understand the EPOLL_CLOEXEC flag.
   */
  if (fd == -1 && (errno == ENOSYS || errno == EINVAL)) {
    fd = uv__epoll_create(256);

    if (fd != -1)
      uv__cloexec(fd, 1);
  }

  loop->backend_fd = fd;
  loop->inotify_fd = -1;
  loop->inotify_watchers = NULL;

  if (fd == -1)
    return -errno;

  return 0;
}